

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aperiodicity_extraction_by_tandem.cc
# Opt level: O2

bool __thiscall
sptk::AperiodicityExtractionByTandem::Run
          (AperiodicityExtractionByTandem *this,vector<double,_std::allocator<double>_> *waveform,
          vector<double,_std::allocator<double>_> *f0,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *aperiodicity)

{
  double dVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pvVar5;
  double *pdVar6;
  int i;
  size_type __new_size;
  size_type __n;
  int f0_length;
  ulong uVar7;
  vector<double,_std::allocator<double>_> *vector;
  ulong uVar8;
  pointer pvVar9;
  long lVar10;
  vector<double_*,_std::allocator<double_*>_> pointers;
  pointer local_50;
  vector<double,_std::allocator<double>_> time_axis;
  
  if ((this->is_valid_ == true) &&
     ((waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    pdVar3 = (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (aperiodicity !=
        (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         *)0x0 && pdVar3 != pdVar4) {
      uVar7 = (ulong)((long)pdVar4 - (long)pdVar3) >> 3;
      dVar1 = this->sampling_rate_;
      f0_length = (int)uVar7;
      uVar8 = 0;
      if (0 < f0_length) {
        uVar8 = uVar7 & 0xffffffff;
      }
      uVar7 = 0;
      do {
        if (uVar8 == uVar7) {
          iVar2 = this->frame_shift_;
          __n = (size_type)f0_length;
          std::vector<double,_std::allocator<double>_>::vector
                    (&time_axis,__n,(allocator_type *)&pointers);
          for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
            time_axis.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7] = (double)(int)uVar7 * ((double)iVar2 / dVar1);
          }
          if (((long)(aperiodicity->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
              (long)(aperiodicity->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start) / 0x18 != __n) {
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::resize(aperiodicity,__n);
          }
          __new_size = (size_type)(this->fft_length_ / 2 + 1);
          for (lVar10 = 0; uVar8 * 0x18 - lVar10 != 0; lVar10 = lVar10 + 0x18) {
            pvVar9 = (aperiodicity->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if (*(long *)((long)&(pvVar9->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + lVar10 + 8) -
                *(long *)((long)&(pvVar9->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + lVar10) >> 3 != __new_size) {
              std::vector<double,_std::allocator<double>_>::resize
                        ((vector<double,_std::allocator<double>_> *)
                         ((long)&(pvVar9->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + lVar10),__new_size);
            }
          }
          pointers.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          pointers.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          pointers.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<double_*,_std::allocator<double_*>_>::reserve(&pointers,__n);
          pvVar5 = (aperiodicity->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (pvVar9 = (aperiodicity->
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start; pvVar9 != pvVar5;
              pvVar9 = pvVar9 + 1) {
            local_50 = (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
            std::vector<double*,std::allocator<double*>>::emplace_back<double*>
                      ((vector<double*,std::allocator<double*>> *)&pointers,&local_50);
          }
          pdVar6 = (waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          world::AperiodicityRatio
                    (pdVar6,(int)((ulong)((long)(waveform->
                                                super__Vector_base<double,_std::allocator<double>_>)
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pdVar6) >> 3),(int)this->sampling_rate_,
                     (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start,f0_length,
                     time_axis.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,this->fft_length_,
                     pointers.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                     super__Vector_impl_data._M_start);
          std::_Vector_base<double_*,_std::allocator<double_*>_>::~_Vector_base
                    (&pointers.super__Vector_base<double_*,_std::allocator<double_*>_>);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&time_axis.super__Vector_base<double,_std::allocator<double>_>);
          return true;
        }
        pdVar6 = pdVar3 + uVar7;
      } while ((0.0 <= *pdVar6) && (uVar7 = uVar7 + 1, *pdVar6 <= dVar1 * 0.5));
    }
  }
  return false;
}

Assistant:

bool AperiodicityExtractionByTandem::Run(
    const std::vector<double>& waveform, const std::vector<double>& f0,
    std::vector<std::vector<double> >* aperiodicity) const {
  // Check inputs.
  if (!is_valid_ || waveform.empty() || f0.empty() || NULL == aperiodicity) {
    return false;
  }

  // Check F0 values to prevent segmentation fault.
  const int f0_length(static_cast<int>(f0.size()));
  const double nyquist_frequency(0.5 * sampling_rate_);
  for (int i(0); i < f0_length; ++i) {
    if (f0[i] < 0.0 || nyquist_frequency < f0[i]) {
      return false;
    }
  }

  const double frame_shift_in_sec(frame_shift_ / sampling_rate_);
  std::vector<double> time_axis(f0_length);
  for (int i(0); i < f0_length; ++i) {
    time_axis[i] = i * frame_shift_in_sec;
  }

  // Prepare memories.
  if (aperiodicity->size() != static_cast<std::size_t>(f0_length)) {
    aperiodicity->resize(f0_length);
  }
  const int length(fft_length_ / 2 + 1);
  for (int i(0); i < f0_length; ++i) {
    if ((*aperiodicity)[i].size() != static_cast<std::size_t>(length)) {
      (*aperiodicity)[i].resize(length);
    }
  }

  std::vector<double*> pointers;
  pointers.reserve(f0_length);
  for (std::vector<double>& vector : *aperiodicity) {
    pointers.push_back(vector.data());
  }

  world::AperiodicityRatio(
      const_cast<double*>(waveform.data()), static_cast<int>(waveform.size()),
      static_cast<int>(sampling_rate_), const_cast<double*>(f0.data()),
      f0_length, const_cast<double*>(time_axis.data()), fft_length_,
      pointers.data());

  return true;
}